

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  sysbvm_tuple_t *psVar1;
  _Bool _Var2;
  int iVar3;
  size_t typeTag;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t *psVar6;
  size_t immediateTypeTag;
  sysbvm_tuple_t *psVar7;
  
  sVar4 = (context->roots).classType;
  if (supertype == 0) {
    supertype = (context->roots).objectType;
  }
  _Var2 = sysbvm_tuple_isKindOf(context,supertype,sVar4);
  if (_Var2) {
    immediateTypeTag = supertype & 0xf;
    if (immediateTypeTag == 0 && (sysbvm_tuple_t *)supertype != (sysbvm_tuple_t *)0x0) {
      sVar4 = *(sysbvm_tuple_t *)supertype;
    }
    else {
      iVar3 = (int)immediateTypeTag;
      psVar7 = (sysbvm_tuple_t *)supertype;
joined_r0x00145927:
      if (iVar3 == 0xf) {
        sVar4 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar7 >> 4);
      }
      else {
        sVar4 = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
      }
    }
  }
  else {
    psVar7 = (sysbvm_tuple_t *)(context->roots).typeType;
    if (((((ulong)psVar7 & 0xf) == 0 && psVar7 != (sysbvm_tuple_t *)0x0) &&
        ((supertype & 0xf) == 0 && (sysbvm_tuple_t *)supertype != (sysbvm_tuple_t *)0x0)) &&
       (psVar6 = (sysbvm_tuple_t *)supertype, (*(sysbvm_tuple_t *)(supertype + 8) & 0x80) == 0)) {
      do {
        if (psVar6 == psVar7) {
          if ((*(sysbvm_tuple_t *)(supertype + 8) & 0x80) == 0) {
            psVar7 = *(sysbvm_tuple_t **)(supertype + 0x30);
          }
          else {
            psVar7 = (sysbvm_tuple_t *)0x0;
          }
          immediateTypeTag = (ulong)psVar7 & 0xf;
          if (immediateTypeTag != 0 || psVar7 == (sysbvm_tuple_t *)0x0) {
            iVar3 = (int)immediateTypeTag;
            goto joined_r0x00145927;
          }
          sVar4 = *psVar7;
          break;
        }
        psVar1 = psVar6 + 6;
        psVar6 = (sysbvm_tuple_t *)*psVar1;
      } while ((sysbvm_tuple_t *)*psVar1 != (sysbvm_tuple_t *)0x0);
    }
  }
  sVar4 = sysbvm_type_createAnonymousMetaclass(context,sVar4);
  sVar5 = sysbvm_type_createAnonymousClass(context,supertype,sVar4);
  *(sysbvm_tuple_t *)(sVar4 + 0xf8) = sVar5;
  return sVar5;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metaclassSupertype = context->roots.classType;
    sysbvm_tuple_t actualSuperType = supertype;
    if(!supertype)
        actualSuperType = context->roots.objectType;

    if(sysbvm_tuple_isKindOf(context, actualSuperType, context->roots.classType))
        metaclassSupertype = sysbvm_tuple_getType(context, actualSuperType);
    else if(sysbvm_type_isDirectSubtypeOf(actualSuperType, context->roots.typeType))
        metaclassSupertype = sysbvm_tuple_getType(context, sysbvm_type_getSupertype(actualSuperType));

    sysbvm_tuple_t metaclass = sysbvm_type_createAnonymousMetaclass(context, metaclassSupertype);
    sysbvm_tuple_t class = sysbvm_type_createAnonymousClass(context, actualSuperType, metaclass);

    // Link together the class with its metaclass.
    sysbvm_metaclass_t *metaclassObject = (sysbvm_metaclass_t*)metaclass;
    metaclassObject->super.thisType = class;
    return class;
}